

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxjenkins.c
# Opt level: O1

int nlalsm(double *vec,int N,int p,int delta,int q,double *phi,double *theta,int M,double *thetac,
          double *var,double eps,double *varcovar,double *residuals)

{
  size_t sVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double *oup;
  void *__dest;
  double *w;
  long lVar9;
  double *phi_00;
  double *theta_00;
  double *phi_01;
  double *theta_01;
  ulong uVar10;
  double *__src;
  double *a;
  double *a_00;
  double *a_01;
  void *__dest_00;
  void *__ptr;
  double *A;
  void *__dest_01;
  double *b;
  double *array;
  double *x;
  double *__src_00;
  int *ipiv;
  long lVar11;
  ulong uVar12;
  size_t __n;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  size_t sVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  long local_140;
  double local_110;
  double local_100;
  int tval;
  
  if (eps < 0.0) {
    dVar28 = sqrt(eps);
  }
  else {
    dVar28 = SQRT(eps);
  }
  uVar4 = q + p * 0x14;
  uVar15 = 0xf;
  if (0xf < (int)uVar4) {
    uVar15 = (ulong)uVar4;
  }
  sVar27 = (long)(N - delta) << 3;
  oup = (double *)malloc(sVar27);
  __dest = malloc(sVar27);
  w = (double *)malloc(sVar27);
  lVar9 = (long)p;
  phi_00 = (double *)malloc(lVar9 * 8);
  theta_00 = (double *)malloc((long)q << 3);
  phi_01 = (double *)malloc(lVar9 * 8);
  theta_01 = (double *)malloc((long)q << 3);
  if (delta < 1) {
    if (N < 1) goto LAB_001358b0;
    memcpy(oup,vec,(ulong)(uint)N << 3);
  }
  else {
    N = diff(vec,N,delta,oup);
    vec = oup;
    if (N < 1) goto LAB_001358b0;
  }
  memcpy(__dest,vec,(ulong)(uint)N << 3);
LAB_001358b0:
  uVar25 = q + p;
  USPE(oup,N,p,q,phi,theta,thetac,var);
  local_140 = 0;
  uVar14 = (ulong)(uint)N;
  uVar5 = uVar25;
  if (M == 1) {
    if (0 < N) {
      dVar30 = *thetac;
      uVar10 = 0;
      do {
        oup[uVar10] = oup[uVar10] - dVar30;
        uVar10 = uVar10 + 1;
      } while (uVar14 != uVar10);
    }
    uVar5 = uVar25 + 1;
    local_140 = 1;
  }
  uVar10 = (ulong)uVar5;
  lVar22 = (long)(int)uVar5;
  sVar1 = lVar22 * 8;
  __src = (double *)malloc(sVar1);
  tval = (int)uVar15;
  iVar6 = tval + N;
  sVar27 = (long)iVar6 * 8 - 8;
  a = (double *)malloc(sVar27);
  a_00 = (double *)malloc(sVar27);
  a_01 = (double *)malloc(sVar27);
  __dest_00 = malloc(sVar27);
  __ptr = malloc(((long)iVar6 + -1) * sVar1);
  A = (double *)malloc(sVar1 * lVar22);
  __dest_01 = malloc(sVar1 * lVar22);
  b = (double *)malloc(sVar1);
  array = (double *)malloc(sVar1);
  x = (double *)malloc(sVar1);
  __src_00 = (double *)malloc(sVar1);
  ipiv = (int *)malloc(lVar22 * 4);
  if (M == 1) {
    *__src = *thetac;
  }
  uVar20 = (ulong)(uint)p;
  if (0 < p) {
    memcpy(__src + local_140,phi,uVar20 * 8);
  }
  uVar19 = (ulong)(uint)q;
  if (0 < q) {
    uVar16 = 0;
    do {
      __src[(long)(p + (int)local_140) + uVar16] = theta[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar19 != uVar16);
  }
  uVar26 = (N + tval) - 1;
  avaluem(oup,N,p,q,phi,theta,tval,a);
  if (1 < iVar6) {
    uVar16 = 1;
    if (1 < (int)uVar26) {
      uVar16 = (ulong)uVar26;
    }
    memcpy(__dest_00,a,uVar16 << 3);
  }
  lVar11 = (long)(int)uVar26;
  if (0 < (int)uVar5) {
    uVar16 = 1;
    if (1 < (int)uVar26) {
      uVar16 = (ulong)uVar26;
    }
    uVar24 = 0;
    pvVar23 = __ptr;
    do {
      dVar30 = __src[uVar24];
      dVar29 = dVar28 * dVar30 + dVar30;
      __src[uVar24] = dVar29;
      if (M == 1) {
        if (0 < p) {
          memcpy(phi_00,__src + 1,uVar20 * 8);
        }
        if (0 < q) {
          uVar12 = 0;
          do {
            theta_00[uVar12] = (__src + lVar9)[uVar12 + 1];
            uVar12 = uVar12 + 1;
          } while (uVar19 != uVar12);
        }
        if (0 < N) {
          dVar31 = *__src;
          uVar12 = 0;
          do {
            w[uVar12] = *(double *)((long)__dest + uVar12 * 8) - dVar31;
            uVar12 = uVar12 + 1;
          } while (uVar14 != uVar12);
        }
      }
      else {
        if (0 < p) {
          memcpy(phi_00,__src,uVar20 * 8);
        }
        if (0 < q) {
          memcpy(theta_00,__src + lVar9,uVar19 * 8);
        }
        if (0 < N) {
          memcpy(w,oup,uVar14 * 8);
        }
      }
      avaluem(w,N,p,q,phi_00,theta_00,tval,a_00);
      if (1 < iVar6) {
        uVar12 = 0;
        do {
          *(double *)((long)pvVar23 + uVar12 * 8) = (a[uVar12] - a_00[uVar12]) / (dVar29 - dVar30);
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
      }
      __src[uVar24] = dVar29 - (dVar29 - dVar30);
      uVar24 = uVar24 + 1;
      pvVar23 = (void *)((long)pvVar23 + lVar11 * 8);
    } while (uVar24 != uVar10);
  }
  if (0 < (int)uVar5) {
    uVar16 = 1;
    if (1 < (int)uVar26) {
      uVar16 = (ulong)uVar26;
    }
    uVar24 = 0;
    pvVar23 = __ptr;
    do {
      lVar17 = uVar24 * uVar10;
      uVar12 = 0;
      pvVar18 = __ptr;
      do {
        A[lVar17 + uVar12] = 0.0;
        if (1 < iVar6) {
          dVar30 = A[lVar17 + uVar12];
          uVar21 = 0;
          do {
            dVar30 = dVar30 + *(double *)((long)pvVar23 + uVar21 * 8) *
                              *(double *)((long)pvVar18 + uVar21 * 8);
            uVar21 = uVar21 + 1;
          } while (uVar16 != uVar21);
          A[lVar17 + uVar12] = dVar30;
        }
        uVar12 = uVar12 + 1;
        pvVar18 = (void *)((long)pvVar18 + lVar11 * 8);
      } while (uVar12 != uVar10);
      uVar24 = uVar24 + 1;
      pvVar23 = (void *)((long)pvVar23 + lVar11 * 8);
    } while (uVar24 != uVar10);
  }
  if (0 < (int)uVar5) {
    uVar16 = 1;
    if (1 < (int)uVar26) {
      uVar16 = (ulong)uVar26;
    }
    uVar24 = 0;
    pvVar23 = __ptr;
    do {
      b[uVar24] = 0.0;
      if (1 < iVar6) {
        dVar30 = b[uVar24];
        uVar12 = 0;
        do {
          dVar30 = dVar30 + *(double *)((long)pvVar23 + uVar12 * 8) * a[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar16 != uVar12);
        b[uVar24] = dVar30;
      }
      dVar30 = A[(int)((uVar5 + 1) * (int)uVar24)];
      if (dVar30 < 0.0) {
        dVar30 = sqrt(dVar30);
      }
      else {
        dVar30 = SQRT(dVar30);
      }
      array[uVar24] = dVar30;
      uVar24 = uVar24 + 1;
      pvVar23 = (void *)((long)pvVar23 + lVar11 * 8);
    } while (uVar24 != uVar10);
  }
  array_max(array,uVar5);
  iVar7 = uVar5 * uVar5;
  __n = (ulong)(iVar7 + (uint)(iVar7 == 0)) << 3;
  sVar27 = uVar20 * 8;
  sVar1 = uVar14 * 8;
  uVar16 = 1;
  if (1 < (int)uVar26) {
    uVar16 = (ulong)uVar26;
  }
  lVar11 = lVar11 * 8;
  local_100 = 0.01;
  local_110 = 2.0;
  uVar3 = 0;
  do {
    uVar8 = uVar3;
    if (0 < (int)uVar5) {
      uVar24 = 0;
      pdVar13 = A;
      do {
        uVar12 = 0;
        do {
          if (uVar8 == 0) {
            pdVar13[uVar12] = pdVar13[uVar12] / (array[uVar24] * array[uVar12]);
          }
          if (uVar24 == uVar12) {
            pdVar13[uVar12] = local_100 + 1.0;
          }
          uVar12 = uVar12 + 1;
        } while (uVar10 != uVar12);
        uVar24 = uVar24 + 1;
        pdVar13 = pdVar13 + uVar10;
      } while (uVar24 != uVar10);
    }
    if (uVar8 == 0 && 0 < (int)uVar5) {
      uVar24 = 0;
      do {
        b[uVar24] = b[uVar24] / array[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar10 != uVar24);
    }
    if (uVar5 != 0) {
      memcpy(__dest_01,A,__n);
    }
    ludecomp(A,uVar5,ipiv);
    linsolve(A,uVar5,b,ipiv,x);
    if (uVar5 != 0) {
      memcpy(A,__dest_01,__n);
    }
    if (0 < (int)uVar5) {
      uVar24 = 0;
      do {
        dVar30 = x[uVar24];
        dVar29 = array[uVar24];
        x[uVar24] = dVar30 / dVar29;
        __src_00[uVar24] = dVar30 / dVar29 + __src[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar10 != uVar24);
    }
    if (M == 1) {
      if (0 < p) {
        memcpy(phi_01,__src_00 + 1,sVar27);
      }
      if (0 < q) {
        uVar24 = 0;
        do {
          theta_01[uVar24] = (__src_00 + lVar9)[uVar24 + 1];
          uVar24 = uVar24 + 1;
        } while (uVar19 != uVar24);
      }
      if (0 < N) {
        dVar30 = *__src_00;
        uVar24 = 0;
        do {
          w[uVar24] = *(double *)((long)__dest + uVar24 * 8) - dVar30;
          uVar24 = uVar24 + 1;
        } while (uVar14 != uVar24);
      }
    }
    else {
      if (0 < p) {
        memcpy(phi_01,__src_00,sVar27);
      }
      if (0 < q) {
        memcpy(theta_01,__src_00 + lVar9,uVar19 * 8);
      }
      if (0 < N) {
        memcpy(w,oup,sVar1);
      }
    }
    avaluem(w,N,p,q,phi_01,theta_01,tval,a_01);
    if (1 < iVar6) {
      memcpy(__dest_00,a_01,uVar16 * 8);
    }
    dVar30 = 0.0;
    dVar29 = 0.0;
    if (1 < iVar6) {
      uVar24 = 0;
      do {
        dVar29 = dVar29 + a_01[uVar24] * a_01[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar26 != uVar24);
    }
    if (1 < iVar6) {
      dVar30 = 0.0;
      uVar24 = 0;
      do {
        dVar30 = dVar30 + a[uVar24] * a[uVar24];
        uVar24 = uVar24 + 1;
      } while (uVar26 != uVar24);
    }
    dVar31 = array_max_abs(x,uVar5);
    if (dVar30 <= dVar29) {
      local_100 = local_100 * local_110;
      local_110 = local_110 + local_110;
    }
    else {
      if (dVar31 < 1e-08) {
LAB_0013690f:
        *var = dVar30 / (double)(int)(N - (uVar25 + (int)local_140));
        dVar28 = 0.0;
        if (M == 1) {
          if (0 < p) {
            uVar14 = 0;
            do {
              dVar28 = dVar28 + phi_01[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar20 != uVar14);
          }
          dVar28 = (1.0 - dVar28) * *__src;
        }
        *thetac = dVar28;
        if (0 < p) {
          memcpy(phi,phi_01,uVar20 << 3);
        }
        if (0 < q) {
          memcpy(theta,theta_01,uVar19 << 3);
        }
        if (0 < (int)uVar5) {
          uVar14 = 0;
          pvVar23 = __ptr;
          do {
            lVar9 = uVar14 * uVar10;
            uVar20 = 0;
            pvVar18 = __ptr;
            do {
              A[lVar9 + uVar20] = 0.0;
              if (1 < iVar6) {
                dVar28 = A[lVar9 + uVar20];
                uVar19 = 0;
                do {
                  dVar28 = dVar28 + *(double *)((long)pvVar23 + uVar19 * 8) *
                                    *(double *)((long)pvVar18 + uVar19 * 8);
                  uVar19 = uVar19 + 1;
                } while (uVar16 != uVar19);
                A[lVar9 + uVar20] = dVar28;
              }
              uVar20 = uVar20 + 1;
              pvVar18 = (void *)((long)pvVar18 + lVar11);
            } while (uVar20 != uVar10);
            uVar14 = uVar14 + 1;
            pvVar23 = (void *)((long)pvVar23 + lVar11);
          } while (uVar14 != uVar10);
        }
        ludecomp(A,uVar5,ipiv);
        minverse(A,uVar5,ipiv,varcovar);
        if (uVar5 != 0) {
          uVar14 = 0;
          do {
            varcovar[uVar14] = varcovar[uVar14] * *var;
            uVar14 = uVar14 + 1;
          } while (iVar7 + (uint)(iVar7 == 0) != uVar14);
        }
        if (0 < N) {
          if ((int)uVar4 < (int)uVar26) {
            uVar4 = uVar26;
          }
          uVar5 = 0xf;
          if (0xf < (int)uVar4) {
            uVar5 = uVar4;
          }
          memcpy(residuals,(void *)((long)__dest_00 + uVar15 * 8 + -8),(ulong)(uVar5 - tval) * 8 + 8
                );
        }
        free(oup);
        free(w);
        free(phi_00);
        free(theta_00);
        free(__src);
        free(a);
        free(a_00);
        free(__ptr);
        free(A);
        free(b);
        free(array);
        free(x);
        free(__src_00);
        free(ipiv);
        free(phi_01);
        free(theta_01);
        free(a_01);
        free(__dest_00);
        free(__dest);
        free(__dest_01);
        return (uint)(0xc6 < uVar8) * 3 + 1;
      }
      if (0 < (int)uVar5) {
        memcpy(__src,__src_00,uVar10 * 8);
      }
      if (M == 1) {
        if (0 < N) {
          dVar29 = *__src;
          uVar24 = 0;
          do {
            w[uVar24] = *(double *)((long)__dest + uVar24 * 8) - dVar29;
            uVar24 = uVar24 + 1;
          } while (uVar14 != uVar24);
        }
      }
      else if (0 < N) {
        memcpy(w,oup,sVar1);
      }
      avaluem(w,N,p,q,phi_01,theta_01,tval,a);
      if (1 < iVar6) {
        memcpy(__dest_00,a,uVar16 * 8);
      }
      if (0 < (int)uVar5) {
        uVar24 = 0;
        pvVar23 = __ptr;
        do {
          dVar29 = __src[uVar24];
          dVar32 = dVar28 * dVar29 + dVar29;
          __src[uVar24] = dVar32;
          if (M == 1) {
            if (0 < p) {
              memcpy(phi_00,__src + 1,sVar27);
            }
            if (0 < q) {
              uVar12 = 0;
              do {
                theta_00[uVar12] = (__src + lVar9)[uVar12 + 1];
                uVar12 = uVar12 + 1;
              } while (uVar19 != uVar12);
            }
            if (0 < N) {
              dVar2 = *__src;
              uVar12 = 0;
              do {
                w[uVar12] = *(double *)((long)__dest + uVar12 * 8) - dVar2;
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
            }
          }
          else {
            if (0 < p) {
              memcpy(phi_00,__src,sVar27);
            }
            if (0 < q) {
              memcpy(theta_00,__src + lVar9,uVar19 * 8);
            }
            if (0 < N) {
              memcpy(w,oup,sVar1);
            }
          }
          avaluem(w,N,p,q,phi_00,theta_00,tval,a_00);
          if (1 < iVar6) {
            uVar12 = 0;
            do {
              *(double *)((long)pvVar23 + uVar12 * 8) =
                   (a[uVar12] - a_00[uVar12]) / (dVar32 - dVar29);
              uVar12 = uVar12 + 1;
            } while (uVar16 != uVar12);
          }
          __src[uVar24] = dVar32 - (dVar32 - dVar29);
          uVar24 = uVar24 + 1;
          pvVar23 = (void *)((long)pvVar23 + lVar11);
        } while (uVar24 != uVar10);
      }
      if (0 < (int)uVar5) {
        uVar24 = 0;
        pvVar23 = __ptr;
        do {
          lVar17 = uVar24 * lVar22;
          uVar12 = 0;
          pvVar18 = __ptr;
          do {
            A[lVar17 + uVar12] = 0.0;
            if (1 < iVar6) {
              dVar29 = A[lVar17 + uVar12];
              uVar21 = 0;
              do {
                dVar29 = dVar29 + *(double *)((long)pvVar23 + uVar21 * 8) *
                                  *(double *)((long)pvVar18 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar16 != uVar21);
              A[lVar17 + uVar12] = dVar29;
            }
            uVar12 = uVar12 + 1;
            pvVar18 = (void *)((long)pvVar18 + lVar11);
          } while (uVar12 != uVar10);
          uVar24 = uVar24 + 1;
          pvVar23 = (void *)((long)pvVar23 + lVar11);
        } while (uVar24 != uVar10);
      }
      if (0 < (int)uVar5) {
        uVar24 = 0;
        pvVar23 = __ptr;
        do {
          b[uVar24] = 0.0;
          if (1 < iVar6) {
            dVar29 = b[uVar24];
            uVar12 = 0;
            do {
              dVar29 = dVar29 + *(double *)((long)pvVar23 + uVar12 * 8) * a[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar16 != uVar12);
            b[uVar24] = dVar29;
          }
          dVar29 = A[(int)((uVar5 + 1) * (int)uVar24)];
          if (dVar29 < 0.0) {
            dVar29 = sqrt(dVar29);
          }
          else {
            dVar29 = SQRT(dVar29);
          }
          array[uVar24] = dVar29;
          uVar24 = uVar24 + 1;
          pvVar23 = (void *)((long)pvVar23 + lVar11);
        } while (uVar24 != uVar10);
      }
      local_100 = local_100 / local_110;
      if (0 < (int)uVar5) {
        uVar24 = 0;
        pdVar13 = A;
        do {
          dVar29 = array[uVar24];
          uVar12 = 0;
          do {
            dVar32 = local_100 + 1.0;
            if (uVar24 != uVar12) {
              dVar32 = pdVar13[uVar12] / (array[uVar12] * dVar29);
            }
            pdVar13[uVar12] = dVar32;
            uVar12 = uVar12 + 1;
          } while (uVar10 != uVar12);
          uVar24 = uVar24 + 1;
          pdVar13 = pdVar13 + uVar10;
        } while (uVar24 != uVar10);
      }
      if ((int)uVar5 < 1) {
        local_110 = 2.0;
      }
      else {
        uVar24 = 0;
        do {
          b[uVar24] = b[uVar24] / array[uVar24];
          uVar24 = uVar24 + 1;
        } while (uVar10 != uVar24);
        local_110 = 2.0;
      }
    }
    if ((dVar31 < 1e-08) || (uVar3 = uVar8 + 1, 0xc6 < uVar8)) goto LAB_0013690f;
  } while( true );
}

Assistant:

int nlalsm(double *vec,int N,int p,int delta, int q, double *phi,double *theta,
		int M,double *thetac,double *var,double eps,double *varcovar,double *residuals) {
	int retval,i,j,l,k,t,t2,it,Norig,qd,itmax;
	double lam,vmul,e1,di,eps2,stepsize,temp,tau,hmax,suminc,sumb;
	double *inp,*b,*at,*at0,*x,*phi0,*theta0,*orig,*A,*g,*D,*h,*binc,*Atemp;
	double *phiinc,*thetainc,*atinc,*resat,*origval;
	int *ipiv;


	eps2 = sqrt(eps);
	lam = 0.01;
	vmul = 2.0;
	e1 = 1.0e-08;
	it = 0;
	Norig = N;
	k = p + q;
	di = eps2;//0.001;//eps2;//0.001
	qd = q + 20 * p;

	if (qd < 15) {
		qd = 15;
	}
	hmax = 1;
	itmax = 200;

	inp = (double*) malloc(sizeof(double) * (N - delta));
	origval = (double*) malloc(sizeof(double) * (N - delta));
	orig = (double*) malloc(sizeof(double) * (N - delta));
	phi0 = (double*) malloc(sizeof(double) * p);
	theta0 = (double*) malloc(sizeof(double) * q);
	phiinc = (double*) malloc(sizeof(double) * p);
	thetainc = (double*) malloc(sizeof(double) * q);
	
	if (delta > 0) {
		N = diff(vec,Norig,delta,inp);
		for (i = 0; i < N;++i) {
			origval[i] = inp[i];
		}
	} else {
		for(i = 0; i < N;++i) {
			inp[i] = vec[i];
			origval[i] = inp[i];
		}
	}
	

	USPE(inp,N,p,q,phi,theta,thetac,var); // Initial Parameters

	if (M == 1) {
		for(i = 0; i < N;++i) {
			inp[i] -= *thetac;
		}
		M = 1;
		k++;
	} else {
		M = 0;
	}
	
	b = (double*) malloc(sizeof(double) * k);
	at = (double*) malloc(sizeof(double) * (N+qd-1));
	at0 = (double*) malloc(sizeof(double) * (N+qd-1));
	atinc = (double*) malloc(sizeof(double) * (N+qd-1));
	resat = (double*) malloc(sizeof(double) * (N+qd-1));
	x = (double*) malloc(sizeof(double) * k * (N+qd-1));
	A = (double*) malloc(sizeof(double) * k * k);
	Atemp = (double*) malloc(sizeof(double) * k * k);
	g = (double*) malloc(sizeof(double) * k);
	D = (double*) malloc(sizeof(double) * k);
	h = (double*) malloc(sizeof(double) * k);
	binc = (double*) malloc(sizeof(double) * k);
	ipiv = (int*) malloc(sizeof(int) * k);
	
	if (M == 1) {
		b[0] = *thetac;
	}
	
	for(i = 0; i < p;++i) {
		b[M+i] = phi[i];
	}
	
	for(i = 0; i < q;++i) {
		b[M+p+i] = theta[i];
	}
	
	//mdisplay(b,1,k);

    avaluem(inp,N,p,q,phi,theta,qd,at);
	
	for(i = 0; i < N+qd-1;++i) {
		resat[i] = at[i];
	}
	//mdisplay(at,1,N+qd-1);
	for(i = 0; i < k;++i) {
		stepsize = b[i]*di;//di;//b[i] * di;
		temp = b[i];
		b[i] += stepsize;
		stepsize = b[i] - temp;
		if (M == 1) {
			for(j = 0;j < p;++j) {
				phi0[j] = b[1+j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+1+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - b[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phi0[j] = b[j];
			}
			for(j = 0; j < q;++j) {
				theta0[j] = b[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}
	    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
	    //mdisplay(inp,1,N);

		t = i * (N + qd - 1);
		
		for(j = 0; j < N + qd - 1;++j) {
			x[t+j] = (at[j] - at0[j]) / stepsize;
		}
		
		b[i] -= stepsize;
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		g[i] = 0.0;
		for(l = 0; l < N + qd - 1;++l) {
			g[i] += x[t+l] * at[l];
		}
		D[i] = sqrt(A[i*k+i]);
	}

	tau = array_max(D,k);
	//printf("TAU %g \n",tau);
	//mdisplay(x,k,N+qd-1);

	while (hmax >= e1 && it < itmax) {
		it++;
		for(i = 0; i < k;++i) {
			for(j = 0; j < k;++j) {
				if (it == 1) {
					A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
				}
				if (i == j) {
					A[i*k+j] = 1.0 + lam;
				}
			}
		}

		if (it == 1) {
			for(i = 0; i < k; ++i) {
				g[i] = g[i] / D[i];
			}
		}

		for(i = 0; i < k*k;++i) {
			Atemp[i] = A[i];
		}
		ludecomp(A,k,ipiv);
		linsolve(A,k,g,ipiv,h);
		for(i = 0; i < k*k;++i) {
			A[i] = Atemp[i];
		}

		for(j = 0; j < k;++j) {
			h[j] = h[j] / D[j];
			binc[j] = b[j] + h[j];
		}

		if (M == 1) {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[1+j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+1+j];
			}

			for(j = 0; j < N;++j) {
				orig[j] = origval[j] - binc[0];
			}
		} else {
			for(j = 0;j < p;++j) {
				phiinc[j] = binc[j];
			}
			for(j = 0; j < q;++j) {
				thetainc[j] = binc[p+j];
			}
			for(j = 0; j < N;++j) {
				orig[j] = inp[j];
			}
		}

	    avaluem(orig,N,p,q,phiinc,thetainc,qd,atinc);
	    for(i = 0; i < N+qd-1;++i) {
	    	resat[i] = atinc[i];
	    }

	    suminc = sosqm(atinc,N+qd-1);
	    sumb = sosqm(at,N+qd-1);

	    hmax = array_max_abs(h,k);
	    //printf("HMAX %g %g %g \n",hmax,suminc,sumb);

	    if (suminc < sumb) {
	    	if (hmax < e1) {
	    		retval = 1;
	    		break;
	    	} else {
	    		for(i = 0; i < k;++i) {
	    			b[i] = binc[i];
	    		}
	    		lam = lam / vmul;
	    		vmul = 2.0;
				if (M == 1) {
					for(j = 0; j < N;++j) {
						orig[j] = origval[j] - b[0];
					}
				} else {
					for(j = 0; j < N;++j) {
						orig[j] = inp[j];
					}				
				}
			    avaluem(orig,N,p,q,phiinc,thetainc,qd,at);
			    for(i = 0; i < N+qd-1;++i) {
			    	resat[i] = at[i];
			    }
				
				for(i = 0; i < k;++i) {
					stepsize = b[i]*di;//di;//b[i] * di;
					temp = b[i];
					b[i] += stepsize;
					stepsize = b[i] - temp;
		
					if (M == 1) {
						for(j = 0;j < p;++j) {
							phi0[j] = b[1+j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+1+j];
						}

						for(j = 0; j < N;++j) {
							orig[j] = origval[j] - b[0];
						}

					} else {
						for(j = 0;j < p;++j) {
							phi0[j] = b[j];
						}
						for(j = 0; j < q;++j) {
							theta0[j] = b[p+j];
						}
						for(j = 0; j < N;++j) {
							orig[j] = inp[j];
						}
					}
				    avaluem(orig,N,p,q,phi0,theta0,qd,at0);	
					t = i * (N + qd - 1);
		
					for(j = 0; j < N + qd - 1;++j) {
						x[t+j] = (at[j] - at0[j]) / stepsize;
					}
		
					b[i] -= stepsize;
				}
				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					for(j = 0; j < k;++j) {
						t2 = j * (N + qd - 1);
						A[i*k+j] = 0.0;
						for(l = 0; l < N + qd -1;++l) {
							A[i*k+j] += x[t+l] * x[t2+l];
						}

					}
				}

				for(i = 0; i < k;++i) {
					t = i * (N + qd - 1);
					g[i] = 0.0;
					for(l = 0; l < N + qd - 1;++l) {
						g[i] += x[t+l] * at[l];
					}
					D[i] = sqrt(A[i*k+i]);
				}
				
				for(i = 0; i < k;++i) {
					for(j = 0; j < k;++j) {
						A[i*k+j] = A[i*k+j] / (D[i] * D[j]);
						if (i == j) {
							A[i*k+j] = 1.0 + lam;
						}
					}
				}

				for(i = 0; i < k; ++i) {
					g[i] = g[i] / D[i];
				}

	    	}
	    } else {
			lam=lam*vmul;
			vmul=2.0*vmul;
	    }

	}
	
	//printf("Iterations %d \n",it);
	
	if (it >= itmax) {
		retval = 4;
	} else if (it < itmax && it > 0) {
		retval = 1;
	}
	// Residual Variance
	*var = sumb * 1.0 /(N - p - q - M);
	//Constant Term
	if (M == 1) {
		temp = 0.0;
		for (i = 0;i < p;++i) {
			temp += phiinc[i];
		}
		*thetac = b[0] * (1.0 - temp);
	} else {
		*thetac = 0.0;
	}
	// Parameters Phi and Theta
	
	for (i = 0; i < p;++i) {
		phi[i] = phiinc[i];
	}
	for (i = 0; i < q;++i) {
		theta[i] = thetainc[i];
	}

	for(i = 0; i < k;++i) {
		t = i * (N + qd - 1);
		for(j = 0; j < k;++j) {
			t2 = j * (N + qd - 1);
			A[i*k+j] = 0.0;
			for(l = 0; l < N + qd -1;++l) {
				A[i*k+j] += x[t+l] * x[t2+l];
			}

		}
	}

	ludecomp(A,k,ipiv);
	minverse(A,k,ipiv,varcovar);

	//mdisplay(varcovar, 1, k*k);

	for(i = 0; i < k*k;++i) {
		varcovar[i] = varcovar[i] * (*var);
	}

	for(i = qd-1; i < N+qd-1;++i) {
		residuals[i-qd+1] = resat[i];
	}


	free(inp);
	free(orig);
	free(phi0);
	free(theta0);
	free(b);
	free(at);
	free(at0);
	free(x);
	free(A);
	free(g);
	free(D);
	free(h);
	free(binc);
	free(ipiv);
	free(phiinc);
	free(thetainc);
	free(atinc);
	free(resat);
	free(origval);
	free(Atemp);
	return retval;
}